

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.hpp
# Opt level: O2

void __thiscall
BasicContainer::build
          (BasicContainer *this,vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *list,
          treenode **cur)

{
  pointer ppBVar1;
  BasicPrimitive *pBVar2;
  __normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
  _Var3;
  __normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
  __last;
  int iVar4;
  treenode *ptVar5;
  long lVar6;
  code *pcVar7;
  long lVar8;
  _Iter_comp_iter<bool_(*)(BasicPrimitive_*,_BasicPrimitive_*)> __comp;
  int i;
  ulong uVar9;
  int iVar10;
  int i_1;
  uint uVar11;
  float fVar12;
  double dVar13;
  undefined1 auVar14 [16];
  double dVar15;
  float fVar16;
  float fVar17;
  AABox accu;
  vector<float,_std::allocator<float>_> prefix_area;
  AABox local_d0;
  vector<float,_std::allocator<float>_> suffix_area;
  _Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> local_88;
  _Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> local_70;
  undefined1 local_58 [16];
  AABox local_48;
  
  ptVar5 = *cur;
  if (ptVar5 == (treenode *)0x0) {
    ptVar5 = (treenode *)operator_new(0x30);
    ptVar5->lc = (treenode *)0x0;
    ptVar5->rc = (treenode *)0x0;
    ptVar5->shape = (BasicPrimitive *)0x0;
    (ptVar5->bound).x1 = 0.0;
    (ptVar5->bound).x2 = 0.0;
    (ptVar5->bound).y1 = 0.0;
    (ptVar5->bound).y2 = 0.0;
    (ptVar5->bound).z1 = 0.0;
    (ptVar5->bound).z2 = 0.0;
    *cur = ptVar5;
  }
  ppBVar1 = (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((long)(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)ppBVar1 == 8) {
    pBVar2 = *ppBVar1;
    ptVar5->shape = pBVar2;
    (*(pBVar2->super_Primitive)._vptr_Primitive[1])(&prefix_area);
    ptVar5 = *cur;
    *(pointer *)&(ptVar5->bound).z1 =
         prefix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    *(pointer *)&ptVar5->bound =
         prefix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(pointer *)&(ptVar5->bound).y1 =
         prefix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    (*((*ppBVar1)->super_Primitive)._vptr_Primitive[1])((AABox *)&prefix_area);
    *(pointer *)&(ptVar5->bound).z1 =
         prefix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    *(pointer *)&ptVar5->bound =
         prefix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(pointer *)&(ptVar5->bound).y1 =
         prefix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_finish;
    uVar9 = 1;
    while( true ) {
      _Var3._M_current =
           (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
           super__Vector_impl_data._M_start;
      __last._M_current =
           (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if ((ulong)((long)__last._M_current - (long)_Var3._M_current >> 3) <= uVar9) break;
      (*(_Var3._M_current[uVar9]->super_Primitive)._vptr_Primitive[1])((AABox *)&suffix_area);
      operator+((AABox *)&prefix_area,&ptVar5->bound,(AABox *)&suffix_area);
      *(pointer *)&(ptVar5->bound).z1 =
           prefix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      *(pointer *)&ptVar5->bound =
           prefix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
      *(pointer *)&(ptVar5->bound).y1 =
           prefix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
      uVar9 = uVar9 + 1;
    }
    fVar16 = (ptVar5->bound).y2 - (ptVar5->bound).y1;
    fVar12 = (ptVar5->bound).x2 - (ptVar5->bound).x1;
    pcVar7 = build::anon_class_1_0_00000001::__invoke;
    if (fVar12 < fVar16) {
      pcVar7 = build::anon_class_1_0_00000001::__invoke;
    }
    fVar17 = (ptVar5->bound).z2 - (ptVar5->bound).z1;
    __comp._M_comp = build::anon_class_1_0_00000001::__invoke;
    if (fVar17 <= fVar16 || fVar17 <= fVar12) {
      __comp._M_comp = pcVar7;
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<BasicPrimitive**,std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(BasicPrimitive*,BasicPrimitive*)>>
              (_Var3,__last,__comp);
    prefix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    prefix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    prefix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    suffix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    suffix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    suffix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<float,_std::allocator<float>_>::resize
              (&prefix_area,
               (long)(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)
                     ._M_impl.super__Vector_impl_data._M_start >> 3);
    std::vector<float,_std::allocator<float>_>::resize
              (&suffix_area,
               (long)(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)
                     ._M_impl.super__Vector_impl_data._M_start >> 3);
    (*((*(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
         super__Vector_impl_data._M_start)->super_Primitive)._vptr_Primitive[1])(&accu);
    uVar9 = 0;
    while( true ) {
      ppBVar1 = (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      lVar8 = (long)(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)ppBVar1;
      if ((ulong)(lVar8 >> 3) <= uVar9) break;
      (*(ppBVar1[uVar9]->super_Primitive)._vptr_Primitive[1])(&local_48);
      operator+(&local_d0,&accu,&local_48);
      accu.x2 = local_d0.x2;
      accu.x1 = local_d0.x1;
      accu.y2 = local_d0.y2;
      accu.y1 = local_d0.y1;
      accu.z2 = local_d0.z2;
      accu.z1 = local_d0.z1;
      fVar12 = (accu.z2 - accu.z1) * (accu.y2 - accu.y1) +
               (accu.x2 - accu.x1) * (accu.y2 - accu.y1) + (accu.x2 - accu.x1) * (accu.z2 - accu.z1)
      ;
      prefix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar9] = fVar12 + fVar12;
      uVar9 = uVar9 + 1;
    }
    (**(code **)(**(long **)((long)ppBVar1 + lVar8 + -8) + 8))(&local_d0);
    uVar9 = (ulong)((long)(list->
                          super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(list->
                         super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
                         _M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
    while( true ) {
      uVar9 = uVar9 - 1;
      if ((int)(uint)uVar9 < 0) break;
      uVar11 = (uint)uVar9 & 0x7fffffff;
      (*((list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
         super__Vector_impl_data._M_start[uVar11]->super_Primitive)._vptr_Primitive[1])(&local_48);
      operator+(&local_d0,&accu,&local_48);
      accu.x2 = local_d0.x2;
      accu.x1 = local_d0.x1;
      accu.y2 = local_d0.y2;
      accu.y1 = local_d0.y1;
      accu.z2 = local_d0.z2;
      accu.z1 = local_d0.z1;
      fVar12 = (accu.z2 - accu.z1) * (accu.y2 - accu.y1) +
               (accu.x2 - accu.x1) * (accu.y2 - accu.y1) + (accu.x2 - accu.x1) * (accu.z2 - accu.z1)
      ;
      suffix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar11] = fVar12 + fVar12;
    }
    _Var3._M_current =
         (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
         super__Vector_impl_data._M_start;
    lVar8 = (long)(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)_Var3._M_current;
    lVar6 = lVar8 >> 3;
    auVar14._8_4_ = (int)(lVar8 >> 0x23);
    auVar14._0_8_ = lVar6;
    auVar14._12_4_ = 0x45300000;
    dVar15 = auVar14._8_8_ - 1.9342813113834067e+25;
    dVar13 = dVar15 + ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
    local_58._8_4_ = SUB84(dVar15,0);
    local_58._0_8_ = dVar13;
    local_58._12_4_ = (int)((ulong)dVar15 >> 0x20);
    dVar13 = round(dVar13 * 0.15);
    iVar10 = (int)dVar13;
    dVar13 = round((double)local_58._0_8_ * 0.85);
    for (lVar8 = (long)iVar10; lVar8 < (int)(dVar13 + -1.0); lVar8 = lVar8 + 1) {
      iVar4 = (int)lVar8;
      if (prefix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[iVar10] +
          suffix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[(long)iVar10 + 1] <=
          prefix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[lVar8] +
          suffix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[lVar8 + 1]) {
        iVar4 = iVar10;
      }
      iVar10 = iVar4;
    }
    std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>::
    vector<__gnu_cxx::__normal_iterator<BasicPrimitive**,std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>>,void>
              ((vector<BasicPrimitive*,std::allocator<BasicPrimitive*>> *)&local_70,_Var3,
               (__normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
                )(_Var3._M_current + (long)iVar10 + 1),(allocator_type *)&local_d0);
    build(this,(vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)&local_70,&(*cur)->lc)
    ;
    std::_Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::~_Vector_base(&local_70)
    ;
    std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>::
    vector<__gnu_cxx::__normal_iterator<BasicPrimitive**,std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>>,void>
              ((vector<BasicPrimitive*,std::allocator<BasicPrimitive*>> *)&local_88,
               (__normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
                )((list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
                  _M_impl.super__Vector_impl_data._M_start + (long)iVar10 + 1),
               (__normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
                )(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
                 _M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_d0);
    build(this,(vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)&local_88,&(*cur)->rc)
    ;
    std::_Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::~_Vector_base(&local_88)
    ;
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&suffix_area.super__Vector_base<float,_std::allocator<float>_>);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&prefix_area.super__Vector_base<float,_std::allocator<float>_>);
  }
  return;
}

Assistant:

void build(std::vector<BasicPrimitive*> list, treenode*& cur)
	{
		// create tree node
		if (!cur) {
			cur = new treenode();
		}
		// bind shape to leaf nodes
		if (list.size() == 1)
		{
			cur->shape = list[0];
			cur->bound = list[0]->boundingVolume();
			return;
		}
		// compute bounding box
		AABox& bound = cur->bound;
		bound = list[0]->boundingVolume();
		for (int i=1; i<list.size(); ++i) {
			bound = bound + list[i]->boundingVolume();
		}
		// sort in sparsest dimension
		auto cmp = +[](BasicPrimitive* a, BasicPrimitive* b) {
			return a->boundingVolume().x1 < b->boundingVolume().x1;
		};
		if (bound.y2 - bound.y1 > bound.x2 - bound.x1) {
			cmp = +[](BasicPrimitive* a, BasicPrimitive* b) {
				return a->boundingVolume().y1 < b->boundingVolume().y1;
			};
		}
		if (bound.z2 - bound.z1 > bound.x2 - bound.x1 &&
			bound.z2 - bound.z1 > bound.y2 - bound.y1) {
			cmp = +[](BasicPrimitive* a, BasicPrimitive* b) {
				return a->boundingVolume().z1 < b->boundingVolume().z1;
			};
		}
		std::sort(list.begin(), list.end(), cmp);
		// determine split position to minimize sum of surface area of bounding boxes
		std::vector<float> prefix_area, suffix_area;
		prefix_area.resize(list.size());
		suffix_area.resize(list.size());
		AABox accu = list[0]->boundingVolume();
		for (int i=0; i<list.size(); ++i) {
			accu = accu + list[i]->boundingVolume();
			prefix_area[i] = accu.surfaceArea();
		}
		accu = list[list.size()-1]->boundingVolume();
		for (int i=list.size()-1; i>=0; --i) {
			accu = accu + list[i]->boundingVolume();
			suffix_area[i] = accu.surfaceArea();
		}
		int rangemin = round(list.size()*0.15);
		int rangemax = round(list.size()*0.85)-1;
		// limit split point from being too close to side
		int best = rangemin;
		for (int i=rangemin; i<rangemax; ++i) {
			if (prefix_area[i] + suffix_area[i+1] < prefix_area[best] + suffix_area[best+1])
				best = i;
		}
		// recursive partition
		build(std::vector<BasicPrimitive*>(list.begin(), list.begin()+best+1), cur->lc);
		build(std::vector<BasicPrimitive*>(list.begin()+best+1, list.end()), cur->rc);
	}